

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O0

void boost::unit_test::utils::print_escaped(ostream *where_to,const_string *value)

{
  initializer_list<std::pair<const_char,_const_char_*>_> __l;
  static_any_base *psVar1;
  static_any_base *psVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  pointer ppVar7;
  basic_cstring<const_char> *in_RSI;
  ostream *in_RDI;
  const_iterator found_ref;
  char c;
  bool _fe_con_65;
  static_any_t _fe_end_65;
  static_any_t _fe_cur_65;
  map<char,_const_char_*,_std::less<char>,_std::allocator<std::pair<const_char,_const_char_*>_>_>
  *in_stack_fffffffffffffed8;
  byte local_f1;
  allocator_type *in_stack_ffffffffffffff20;
  _Self in_stack_ffffffffffffff28;
  _Self in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff44;
  uint uVar9;
  char *local_b8;
  static_any_base *local_b0;
  char *local_a0;
  static_any_base *local_98;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 *local_20;
  undefined8 local_18;
  ostream *local_8;
  
  local_8 = in_RDI;
  if ((print_escaped(std::ostream&,boost::unit_test::basic_cstring<char_const>)::char_type == '\0')
     && (iVar5 = __cxa_guard_acquire(&print_escaped(std::ostream&,boost::unit_test::basic_cstring<char_const>)
                                      ::char_type), iVar5 != 0)) {
    local_38 = 0x22;
    pcStack_30 = "quot";
    local_48 = 0x27;
    pcStack_40 = "apos";
    local_58 = 0x26;
    pcStack_50 = "amp";
    local_68 = 0x3e;
    pcStack_60 = "gt";
    local_78 = 0x3c;
    pcStack_70 = "lt";
    local_20 = &local_78;
    local_18 = 5;
    std::allocator<std::pair<const_char,_const_char_*>_>::allocator
              ((allocator<std::pair<const_char,_const_char_*>_> *)0x284017);
    __l._M_len._0_4_ = in_stack_ffffffffffffff40;
    __l._M_array = (iterator)in_stack_ffffffffffffff38;
    __l._M_len._4_4_ = in_stack_ffffffffffffff44;
    std::
    map<char,_const_char_*,_std::less<char>,_std::allocator<std::pair<const_char,_const_char_*>_>_>
    ::map((map<char,_const_char_*,_std::less<char>,_std::allocator<std::pair<const_char,_const_char_*>_>_>
           *)in_stack_ffffffffffffff30._M_node,__l,(less<char> *)in_stack_ffffffffffffff28._M_node,
          in_stack_ffffffffffffff20);
    std::allocator<std::pair<const_char,_const_char_*>_>::~allocator
              ((allocator<std::pair<const_char,_const_char_*>_> *)0x28404f);
    __cxa_atexit(std::
                 map<char,_const_char_*,_std::less<char>,_std::allocator<std::pair<const_char,_const_char_*>_>_>
                 ::~map,&print_escaped::char_type,&__dso_handle);
    __cxa_guard_release(&print_escaped(std::ostream&,boost::unit_test::basic_cstring<char_const>)::
                         char_type);
  }
  for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RSI);
  integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x28408c);
  local_a0 = (char *)for_each::begin<boost::unit_test::basic_cstring<char_const>>(in_RSI);
  local_98 = (static_any_base *)&local_a0;
  bVar3 = for_each::static_any_base::operator_cast_to_bool(local_98);
  if (!bVar3) {
    for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RSI);
    integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x28410c);
    local_b8 = (char *)for_each::end<boost::unit_test::basic_cstring<char_const>>(in_RSI);
    local_b0 = (static_any_base *)&local_b8;
    bVar3 = for_each::static_any_base::operator_cast_to_bool(local_b0);
    if (!bVar3) {
      uVar9 = 1;
      while( true ) {
        psVar2 = local_98;
        psVar1 = local_b0;
        local_f1 = 0;
        if ((uVar9 & 1) != 0) {
          for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RSI);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x284177);
          bVar3 = for_each::done<boost::unit_test::basic_cstring<char_const>>(psVar2,psVar1,in_RSI);
          local_f1 = bVar3 ^ 0xff;
        }
        psVar1 = local_98;
        if ((local_f1 & 1) == 0) break;
        uVar9 = 0;
        for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RSI);
        integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x2841d1);
        bVar4 = for_each::deref<char,boost::unit_test::basic_cstring<char_const>>(psVar1,in_RSI);
        uVar8 = (uint)bVar4;
        while (psVar1 = local_98, (((byte)uVar9 ^ 0xff) & 1) != 0) {
          std::
          map<char,_const_char_*,_std::less<char>,_std::allocator<std::pair<const_char,_const_char_*>_>_>
          ::find(in_stack_fffffffffffffed8,(key_type_conflict *)0x284204);
          std::
          map<char,_const_char_*,_std::less<char>,_std::allocator<std::pair<const_char,_const_char_*>_>_>
          ::end(in_stack_fffffffffffffed8);
          bVar3 = std::operator!=((_Self *)&stack0xffffffffffffff30,
                                  (_Self *)&stack0xffffffffffffff28);
          if (bVar3) {
            poVar6 = std::operator<<(local_8,'&');
            ppVar7 = std::_Rb_tree_const_iterator<std::pair<const_char,_const_char_*>_>::operator->
                               ((_Rb_tree_const_iterator<std::pair<const_char,_const_char_*>_> *)
                                0x284250);
            poVar6 = std::operator<<(poVar6,ppVar7->second);
            std::operator<<(poVar6,';');
          }
          else {
            std::operator<<(local_8,(char)uVar8);
          }
          uVar9 = 1;
        }
        if ((uVar9 & 1) != 0) {
          for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RSI);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x2842b7);
          for_each::next<boost::unit_test::basic_cstring<char_const>>(psVar1,in_RSI);
        }
      }
    }
  }
  return;
}

Assistant:

inline void
print_escaped( std::ostream& where_to, const_string value )
{
#if !defined(BOOST_NO_CXX11_HDR_INITIALIZER_LIST) && !defined(BOOST_NO_CXX11_UNIFIED_INITIALIZATION_SYNTAX)
    static std::map<char,char const*> const char_type{{
        {'<' , "lt"},
        {'>' , "gt"},
        {'&' , "amp"},
        {'\'', "apos"},
        {'"' , "quot"}
    }};
#else
    static std::map<char,char const*> char_type;

    if( char_type.empty() ) {
        char_type['<'] = "lt";
        char_type['>'] = "gt";
        char_type['&'] = "amp";
        char_type['\'']= "apos";
        char_type['"'] = "quot";
    }
#endif

    BOOST_TEST_FOREACH( char, c, value ) {
        std::map<char,char const*>::const_iterator found_ref = char_type.find( c );

        if( found_ref != char_type.end() )
            where_to << '&' << found_ref->second << ';';
        else
            where_to << c;
    }
}